

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_containers.hpp
# Opt level: O0

void __thiscall
spirv_cross::SmallVector<spvc_combined_image_sampler,_8UL>::SmallVector
          (SmallVector<spvc_combined_image_sampler,_8UL> *this)

{
  spvc_combined_image_sampler *psVar1;
  SmallVector<spvc_combined_image_sampler,_8UL> *this_local;
  
  VectorView<spvc_combined_image_sampler>::VectorView
            (&this->super_VectorView<spvc_combined_image_sampler>);
  this->buffer_capacity = 0;
  psVar1 = AlignedBuffer<spvc_combined_image_sampler,_8UL>::data(&this->stack_storage);
  (this->super_VectorView<spvc_combined_image_sampler>).ptr = psVar1;
  this->buffer_capacity = 8;
  return;
}

Assistant:

SmallVector() SPIRV_CROSS_NOEXCEPT
	{
		this->ptr = stack_storage.data();
		buffer_capacity = N;
	}